

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# counting_list.cpp
# Opt level: O1

int main(void)

{
  istream *piVar1;
  long *plVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  long lVar6;
  undefined1 auVar7 [16];
  int Ly;
  int Lx;
  vector<double,_std::allocator<double>_> field;
  vector<double,_std::allocator<double>_> inter;
  double t_max;
  span_t span;
  graph lat;
  double t_step;
  double t_min;
  int local_170;
  int local_16c;
  vector<double,_std::allocator<double>_> local_168;
  vector<double,_std::allocator<double>_> local_148;
  double local_128;
  double local_120;
  DenseStorage<long,__1,__1,__1,_0> local_118;
  double local_100;
  graph local_f8;
  double local_a8;
  double local_a0;
  basis local_98;
  unitcell local_80;
  double local_48;
  double dStack_40;
  
  local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  piVar1 = (istream *)std::istream::operator>>((istream *)&std::cin,&local_16c);
  std::istream::operator>>(piVar1,&local_170);
  lattice::basis::simple(&local_98,2);
  lattice::unitcell::simple(&local_80,2);
  lVar6 = (long)local_16c;
  lVar4 = (long)local_170;
  local_118.m_data = (long *)0x0;
  local_118.m_rows = 0;
  local_118.m_cols = 0;
  Eigen::DenseStorage<long,_-1,_-1,_-1,_0>::resize(&local_118,4,2,2);
  if (0 < local_118.m_cols * local_118.m_rows) {
    memset(local_118.m_data,0,local_118.m_cols * local_118.m_rows * 8);
  }
  *local_118.m_data = lVar6;
  local_118.m_data[local_118.m_rows + 1] = lVar4;
  lattice::graph::graph(&local_f8,&local_98,&local_80,(span_t *)&local_118,periodic);
  free(local_118.m_data);
  std::vector<lattice::unitcell::bond_t,_std::allocator<lattice::unitcell::bond_t>_>::~vector
            (&local_80.bonds_);
  std::vector<lattice::unitcell::site_t,_std::allocator<lattice::unitcell::site_t>_>::~vector
            (&local_80.sites_);
  free(local_98.basis_.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.
       m_data);
  std::vector<double,_std::allocator<double>_>::resize
            (&local_148,
             ((long)local_f8.bonds_.
                    super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_f8.bonds_.
                    super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555);
  if (local_f8.bonds_.
      super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_f8.bonds_.
      super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      std::istream::_M_extract<double>((double *)&std::cin);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)(((long)local_f8.bonds_.
                                    super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_f8.bonds_.
                                    super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            -0x5555555555555555));
  }
  std::vector<double,_std::allocator<double>_>::resize
            (&local_168,
             ((long)local_f8.sites_.
                    super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_f8.sites_.
                    super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7);
  if (local_f8.sites_.
      super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_f8.sites_.
      super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar5 = 0;
    do {
      std::istream::_M_extract<double>((double *)&std::cin);
      uVar5 = uVar5 + 1;
    } while (uVar5 < (ulong)(((long)local_f8.sites_.
                                    super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                                    ._M_impl.super__Vector_impl_data._M_finish -
                              (long)local_f8.sites_.
                                    super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                                    ._M_impl.super__Vector_impl_data._M_start >> 3) *
                            0x6db6db6db6db6db7));
  }
  piVar1 = std::istream::_M_extract<double>((double *)&std::cin);
  piVar1 = std::istream::_M_extract<double>((double *)piVar1);
  std::istream::_M_extract<double>((double *)piVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"# Lx = ",7);
  plVar2 = (long *)std::ostream::operator<<((ostream *)&std::cout,local_16c);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  poVar3 = (ostream *)std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"# Ly = ",7);
  plVar2 = (long *)std::ostream::operator<<((ostream *)poVar3,local_170);
  std::ios::widen((char)*(undefined8 *)(*plVar2 + -0x18) + (char)plVar2);
  std::ostream::put((char)plVar2);
  std::ostream::flush();
  lVar4 = std::cout;
  *(uint *)(std::logic_error::logic_error + *(long *)(std::cout + -0x18)) =
       *(uint *)(std::logic_error::logic_error + *(long *)(std::cout + -0x18)) & 0xfffffefb | 0x100;
  *(undefined8 *)(&std::bad_alloc::typeinfo + *(long *)(lVar4 + -0x18)) = 0xb;
  if (local_a0 <= local_120) {
    do {
      local_128 = local_a0;
      local_100 = ising::counting::free_energy<lattice::graph>
                            (1.0 / local_a0,&local_f8,&local_148,&local_168);
      lVar4 = ((long)local_f8.sites_.
                     super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)local_f8.sites_.
                     super__Vector_base<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x6db6db6db6db6db7;
      auVar7._8_4_ = (int)((ulong)lVar4 >> 0x20);
      auVar7._0_8_ = lVar4;
      auVar7._12_4_ = 0x45300000;
      local_48 = (double)CONCAT44(0x43300000,(int)lVar4) - 4503599627370496.0;
      dStack_40 = auVar7._8_8_ - 1.9342813113834067e+25;
      poVar3 = std::ostream::_M_insert<double>(local_128);
      local_80.dim_._0_1_ = 0x20;
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,(char *)&local_80,1);
      poVar3 = std::ostream::_M_insert<double>(local_100 / (dStack_40 + local_48));
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar3 + -0x18) + (char)poVar3);
      std::ostream::put((char)poVar3);
      std::ostream::flush();
      local_a0 = local_128 + local_a8;
    } while (local_a0 <= local_120);
  }
  if (local_f8.bonds_.
      super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_f8.bonds_.
                    super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_f8.bonds_.
                          super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.bonds_.
                          super__Vector_base<lattice::graph::bond_t,_std::allocator<lattice::graph::bond_t>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~vector(&local_f8.coordinates_);
  std::vector<lattice::graph::site_t,_std::allocator<lattice::graph::site_t>_>::~vector
            (&local_f8.sites_);
  if (local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_148.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
  int Lx, Ly; // system size
  std::vector<double> inter, field;
  double t_min, t_max, t_step;

  std::cin >> Lx >> Ly;
  auto lat = lattice::graph(lattice::basis::simple(2), lattice::unitcell::simple(2), lattice::extent(Lx, Ly));
  inter.resize(lat.num_bonds());
  for (std::size_t b = 0; b < lat.num_bonds(); ++b) std::cin >> inter[b];
  field.resize(lat.num_sites());
  for (std::size_t s = 0; s < lat.num_sites(); ++s) std::cin >> field[s];
  std::cin >> t_min >> t_max >> t_step;

  std::cout << "# Lx = " << Lx <<std::endl << "# Ly = " << Ly <<std::endl;
  std::cout << std::scientific << std::setprecision(11);
  for (double t = t_min; t <= t_max; t += t_step) {
    double beta = 1 / t;
    double f = ising::counting::free_energy_density(beta, lat, inter, field);
    std::cout << t << ' ' << f << std::endl;
  }
}